

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

int __thiscall
flow::PhiNode::clone(PhiNode *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  pointer local_18;
  PhiNode *this_local;
  
  local_18 = (pointer)__fn;
  this_local = this;
  __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Instr::operands((Instr *)__fn);
  Value::name_abi_cxx11_((Value *)__fn);
  std::
  make_unique<flow::PhiNode,std::vector<flow::Value*,std::allocator<flow::Value*>>const&,std::__cxx11::string_const&>
            ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&stack0xffffffffffffffe0,
             __args_1);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::PhiNode,std::default_delete<flow::PhiNode>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)this,
             (unique_ptr<flow::PhiNode,_std::default_delete<flow::PhiNode>_> *)
             &stack0xffffffffffffffe0);
  std::unique_ptr<flow::PhiNode,_std::default_delete<flow::PhiNode>_>::~unique_ptr
            ((unique_ptr<flow::PhiNode,_std::default_delete<flow::PhiNode>_> *)
             &stack0xffffffffffffffe0);
  return (int)this;
}

Assistant:

std::unique_ptr<Instr> PhiNode::clone() {
  return std::make_unique<PhiNode>(operands(), name());
}